

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_add_exten_to_list(nifti1_extension *new_ext,nifti1_extension **list,int new_length)

{
  nifti1_extension *__src;
  nifti1_extension *pnVar1;
  nifti1_extension *tmplist;
  int new_length_local;
  nifti1_extension **list_local;
  nifti1_extension *new_ext_local;
  
  __src = *list;
  pnVar1 = (nifti1_extension *)malloc((long)new_length << 4);
  *list = pnVar1;
  if (*list == (nifti1_extension *)0x0) {
    fprintf(_stderr,"** failed to alloc %d extension structs (%d bytes)\n",(ulong)(uint)new_length,
            (ulong)(uint)(new_length << 4));
    if (__src == (nifti1_extension *)0x0) {
      new_ext_local._4_4_ = -1;
    }
    else {
      *list = __src;
      new_ext_local._4_4_ = -1;
    }
  }
  else {
    if (__src != (nifti1_extension *)0x0) {
      memcpy(*list,__src,(long)(new_length + -1) << 4);
      free(__src);
    }
    (*list)[new_length + -1].esize = new_ext->esize;
    (*list)[new_length + -1].ecode = new_ext->ecode;
    (*list)[new_length + -1].edata = new_ext->edata;
    if (2 < g_opts.debug) {
      fprintf(_stderr,"+d allocated and appended extension #%d to list\n",(ulong)(uint)new_length);
    }
    new_ext_local._4_4_ = 0;
  }
  return new_ext_local._4_4_;
}

Assistant:

static int nifti_add_exten_to_list( nifti1_extension *  new_ext,
                                    nifti1_extension ** list, int new_length )
{
   nifti1_extension * tmplist;

   tmplist = *list;
   *list = (nifti1_extension *)malloc(new_length * sizeof(nifti1_extension));

   /* check for failure first */
   if( ! *list ){
      fprintf(stderr,"** failed to alloc %d extension structs (%d bytes)\n",
              new_length, new_length*(int)sizeof(nifti1_extension));
      if( !tmplist ) return -1;  /* no old list to lose */

      *list = tmplist;  /* reset list to old one */
      return -1;
   }

   /* if an old list exists, copy the pointers and free the list */
   if( tmplist ){
      memcpy(*list, tmplist, (new_length-1)*sizeof(nifti1_extension));
      free(tmplist);
   }

   /* for some reason, I just don't like struct copy... */
   (*list)[new_length-1].esize = new_ext->esize;
   (*list)[new_length-1].ecode = new_ext->ecode;
   (*list)[new_length-1].edata = new_ext->edata;

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d allocated and appended extension #%d to list\n",
              new_length);

   return 0;
}